

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char in_AL;
  undefined8 in_RCX;
  int op;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_130;
  undefined8 *local_110;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_48;
  char *z;
  uint uStack_38;
  char c;
  int i;
  va_list ap;
  char *zTypes_local;
  int iDest_local;
  Vdbe *p_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  uStack_38 = 0x18;
  z._4_4_ = 0;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].reg_save_area = zTypes;
  do {
    z._3_1_ = *(char *)((long)ap[0].reg_save_area + (long)z._4_4_);
    if (z._3_1_ == '\0') {
      sqlite3VdbeAddOp2(p,0x43,iDest,z._4_4_);
      return;
    }
    if (z._3_1_ == 's') {
      if (uStack_38 < 0x29) {
        local_110 = (undefined8 *)((long)(int)uStack_38 + (long)ap[0].overflow_arg_area);
        uStack_38 = uStack_38 + 8;
      }
      else {
        local_110 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_48 = (char *)*local_110;
      op = 0x61;
      if (local_48 == (char *)0x0) {
        op = 0x3b;
      }
      sqlite3VdbeAddOp4(p,op,0,iDest + z._4_4_,0,local_48,0);
    }
    else {
      if (z._3_1_ != 'i') {
        return;
      }
      if (uStack_38 < 0x29) {
        local_130 = (int *)((long)(int)uStack_38 + (long)ap[0].overflow_arg_area);
        uStack_38 = uStack_38 + 8;
      }
      else {
        local_130 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      sqlite3VdbeAddOp2(p,0x38,*local_130,iDest + z._4_4_);
    }
    z._4_4_ = z._4_4_ + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}